

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

st_quicly_pn_space_t * setup_send_space(quicly_conn_t *conn,size_t epoch,quicly_send_context_t *s)

{
  long lVar1;
  undefined1 uVar2;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  st_quicly_pn_space_t *space;
  st_quicly_pn_space_t *local_28;
  
  switch(in_RSI) {
  case 0:
    if ((*(long *)(in_RDI + 0x530) == 0) ||
       (lVar1 = *(long *)(in_RDI + 0x530), *in_RDX = lVar1 + 0x58, *(long *)(lVar1 + 0x58) == 0)) {
      return (st_quicly_pn_space_t *)0x0;
    }
    *(undefined1 *)(in_RDX + 1) = 0xc0;
    local_28 = *(st_quicly_pn_space_t **)(in_RDI + 0x530);
    break;
  case 1:
  case 3:
    if ((*(long *)(in_RDI + 0x540) == 0) || (*(long *)(*(long *)(in_RDI + 0x540) + 0xc0) == 0)) {
      return (st_quicly_pn_space_t *)0x0;
    }
    if ((uint)(in_RSI == 1) == *(uint *)(*(long *)(in_RDI + 0x540) + 0x120)) {
      return (st_quicly_pn_space_t *)0x0;
    }
    *in_RDX = *(long *)(in_RDI + 0x540) + 0xb8;
    uVar2 = 0x40;
    if (in_RSI == 1) {
      uVar2 = 0xd0;
    }
    *(undefined1 *)(in_RDX + 1) = uVar2;
    local_28 = *(st_quicly_pn_space_t **)(in_RDI + 0x540);
    break;
  case 2:
    if ((*(long *)(in_RDI + 0x538) == 0) ||
       (lVar1 = *(long *)(in_RDI + 0x538), *in_RDX = lVar1 + 0x58, *(long *)(lVar1 + 0x58) == 0)) {
      return (st_quicly_pn_space_t *)0x0;
    }
    *(undefined1 *)(in_RDX + 1) = 0xe0;
    local_28 = *(st_quicly_pn_space_t **)(in_RDI + 0x538);
    break;
  default:
    __assert_fail("!\"logic flaw\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xf79,
                  "struct st_quicly_pn_space_t *setup_send_space(quicly_conn_t *, size_t, quicly_send_context_t *)"
                 );
  }
  return local_28;
}

Assistant:

static struct st_quicly_pn_space_t *setup_send_space(quicly_conn_t *conn, size_t epoch, quicly_send_context_t *s)
{
    struct st_quicly_pn_space_t *space = NULL;

    switch (epoch) {
    case QUICLY_EPOCH_INITIAL:
        if (conn->initial == NULL || (s->current.cipher = &conn->initial->cipher.egress)->aead == NULL)
            return NULL;
        s->current.first_byte = QUICLY_PACKET_TYPE_INITIAL;
        space = &conn->initial->super;
        break;
    case QUICLY_EPOCH_HANDSHAKE:
        if (conn->handshake == NULL || (s->current.cipher = &conn->handshake->cipher.egress)->aead == NULL)
            return NULL;
        s->current.first_byte = QUICLY_PACKET_TYPE_HANDSHAKE;
        space = &conn->handshake->super;
        break;
    case QUICLY_EPOCH_0RTT:
    case QUICLY_EPOCH_1RTT:
        if (conn->application == NULL || conn->application->cipher.egress.key.header_protection == NULL)
            return NULL;
        if ((epoch == QUICLY_EPOCH_0RTT) == conn->application->one_rtt_writable)
            return NULL;
        s->current.cipher = &conn->application->cipher.egress.key;
        s->current.first_byte = epoch == QUICLY_EPOCH_0RTT ? QUICLY_PACKET_TYPE_0RTT : QUICLY_QUIC_BIT;
        space = &conn->application->super;
        break;
    default:
        assert(!"logic flaw");
        break;
    }

    return space;
}